

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O3

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_StrCaseEq_Test::Body
          (iu_SyntaxTest_x_iutest_x_StrCaseEq_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *p;
  char **in_R9;
  AssertionResult iutest_ar;
  char test [5];
  allocator<char> local_209;
  AssertionResult local_208;
  AssertionHelper local_1e0;
  char local_1b0 [8];
  undefined1 local_1a8 [392];
  
  builtin_strncpy(local_1b0,"Test",5);
  local_1a8._0_8_ = "test";
  local_1e0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = local_1b0;
  iutest::internal::StrCaseEqHelper::Assertion<char_const*,char_const*>
            (&local_208,(StrCaseEqHelper *)0x335edb,"test",local_1a8,(char **)&local_1e0,in_R9);
  if (local_208.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    local_1e0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = "test";
    iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a8,(char **)&local_1e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,local_208.m_message._M_dataplus._M_p,&local_209);
    local_1e0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
    ;
    local_1e0.m_part_result.super_iuCodeMessage.m_line = 0x1c3;
    local_1e0.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1e0,(Fixed *)local_1a8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1e0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1e0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1e0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_message._M_dataplus._M_p == &local_208.m_message.field_2) {
      return;
    }
  }
  else {
    paVar1 = &local_208.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_208.m_message._M_dataplus._M_p,
                      local_208.m_message.field_2._M_allocated_capacity + 1);
    }
    local_1a8._0_8_ = "test";
    local_1e0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = local_1b0;
    iutest::internal::StrCaseEqHelper::Assertion<char_const*,char_const*>
              (&local_208,(StrCaseEqHelper *)0x335edb,"test",local_1a8,(char **)&local_1e0,in_R9);
    if (local_208.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      local_1e0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = "test";
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a8,(char **)&local_1e0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e0,local_208.m_message._M_dataplus._M_p,&local_209);
      local_1e0.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
      ;
      local_1e0.m_part_result.super_iuCodeMessage.m_line = 0x1c5;
      local_1e0.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1e0,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1e0.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1e0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1e0.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_208.m_message._M_dataplus._M_p,
                      local_208.m_message.field_2._M_allocated_capacity + 1);
    }
    local_1a8._0_8_ = "test";
    local_1e0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = local_1b0;
    iutest::internal::StrCaseEqHelper::Assertion<char_const*,char_const*>
              (&local_208,(StrCaseEqHelper *)0x335edb,"test",local_1a8,(char **)&local_1e0,in_R9);
    if (local_208.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      local_1e0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = "test";
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a8,(char **)&local_1e0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e0,local_208.m_message._M_dataplus._M_p,&local_209);
      local_1e0.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
      ;
      local_1e0.m_part_result.super_iuCodeMessage.m_line = 0x1c7;
      local_1e0.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
      iutest::AssertionHelper::OnFixed(&local_1e0,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1e0.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1e0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1e0.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_208.m_message._M_dataplus._M_p,
                      local_208.m_message.field_2._M_allocated_capacity + 1);
    }
    local_1a8._0_8_ = "test";
    local_1e0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = local_1b0;
    iutest::internal::StrCaseEqHelper::Assertion<char_const*,char_const*>
              (&local_208,(StrCaseEqHelper *)0x335edb,"test",local_1a8,(char **)&local_1e0,in_R9);
    if (local_208.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      local_1e0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = "test";
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a8,(char **)&local_1e0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e0,local_208.m_message._M_dataplus._M_p,&local_209);
      local_1e0.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
      ;
      local_1e0.m_part_result.super_iuCodeMessage.m_line = 0x1c9;
      local_1e0.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffd;
      iutest::AssertionHelper::OnFixed(&local_1e0,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_1e0.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_1e0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_1e0.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.m_message._M_dataplus._M_p == paVar1) {
      return;
    }
  }
  operator_delete(local_208.m_message._M_dataplus._M_p,
                  local_208.m_message.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

IUTEST(SyntaxTest, StrCaseEq)
{
    const char test[] = "Test";
    if( const char* p = "test" )
        IUTEST_ASSERT_STRCASEEQ(p, test) << p;
    if( const char* p = "test" )
        IUTEST_EXPECT_STRCASEEQ(p, test) << p;
    if( const char* p = "test" )
        IUTEST_INFORM_STRCASEEQ(p, test) << p;
    if( const char* p = "test" )
        IUTEST_ASSUME_STRCASEEQ(p, test) << p;
}